

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

internal_node<char,_false> *
immutable::rrb_details::internal_node_dec<char,false>(internal_node<char,_false> *original)

{
  internal_node<char,_false> *piVar1;
  uint32_t i;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = original->len - 1;
  piVar1 = (internal_node<char,_false> *)malloc((ulong)uVar4 * 8 + 0x20);
  piVar1->len = uVar4;
  piVar1->type = INTERNAL_NODE;
  (piVar1->size_table).ptr = (rrb_size_table<false> *)0x0;
  ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
            (&piVar1->size_table,&original->size_table);
  piVar1->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar1 + 1);
  uVar3 = (ulong)piVar1->len;
  lVar5 = 0;
  memset(piVar1 + 1,0,uVar3 << 3);
  for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
               ((long)&piVar1->child->ptr + lVar5),
               (ref<immutable::rrb_details::internal_node<char,_false>_> *)
               ((long)&original->child->ptr + lVar5));
    uVar3 = (ulong)piVar1->len;
    lVar5 = lVar5 + 8;
  }
  piVar1->guid = 0;
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_dec(const internal_node<T, atomic_ref_counting>* original)
      {
      internal_node<T, atomic_ref_counting>* node = (internal_node<T, atomic_ref_counting>*)malloc(sizeof(internal_node<T, atomic_ref_counting>) + (original->len - 1) * sizeof(ref<internal_node<T, atomic_ref_counting>>));
      node->len = original->len - 1;
      node->type = INTERNAL_NODE;
      node->size_table.ptr = nullptr;
      node->size_table = original->size_table;
      node->child = (ref<internal_node<T, atomic_ref_counting>>*)((char*)node + sizeof(internal_node<T, atomic_ref_counting>));
      memset(node->child, 0, node->len * sizeof(ref<internal_node<T, atomic_ref_counting>>)); // init pointers to zero      
      for (uint32_t i = 0; i < node->len; ++i)
        node->child[i] = original->child[i];
      node->guid = 0;
      return node;
      }